

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

Builder * __thiscall
capnp::Orphan<capnp::DynamicValue>::get
          (Builder *__return_storage_ptr__,Orphan<capnp::DynamicValue> *this)

{
  undefined8 uVar1;
  Builder value;
  ListBuilder builder;
  ListBuilder builder_00;
  StructBuilder builder_01;
  Builder value_00;
  Builder value_01;
  Builder value_02;
  ListSchema schema;
  ListSchema schema_00;
  ElementSize elementSize;
  Which WVar2;
  DynamicEnum value_03;
  Fault local_200;
  Fault f;
  undefined1 local_1e8 [48];
  Schema local_1b8;
  StructSize local_1ac;
  StructBuilder local_1a8;
  Schema local_180;
  Builder local_178;
  ListBuilder local_148;
  int64_t local_120;
  anon_union_8_2_eba6ea51_for_Type_5 local_118;
  Builder local_110;
  Schema local_d8;
  StructSize local_cc;
  ListBuilder local_c8;
  int64_t local_a0;
  anon_union_8_2_eba6ea51_for_Type_5 local_98;
  Builder local_90;
  ArrayPtr<unsigned_char> local_58;
  Builder local_48;
  int64_t local_30;
  undefined2 local_28;
  undefined6 uStack_26;
  Orphan<capnp::DynamicValue> *local_18;
  Orphan<capnp::DynamicValue> *this_local;
  
  local_18 = this;
  this_local = (Orphan<capnp::DynamicValue> *)__return_storage_ptr__;
  switch(this->type) {
  case UNKNOWN:
    DynamicValue::Builder::Builder(__return_storage_ptr__,(nullptr_t)0x0);
    break;
  case VOID:
    DynamicValue::Builder::Builder(__return_storage_ptr__);
    break;
  case BOOL:
    DynamicValue::Builder::Builder(__return_storage_ptr__,(bool)((this->field_1).field9[0] & 1));
    break;
  case INT:
    DynamicValue::Builder::Builder(__return_storage_ptr__,(this->field_1).intValue);
    break;
  case UINT:
    DynamicValue::Builder::Builder(__return_storage_ptr__,(this->field_1).uintValue);
    break;
  case FLOAT:
    DynamicValue::Builder::Builder(__return_storage_ptr__,(this->field_1).floatValue);
    break;
  case TEXT:
    capnp::_::OrphanBuilder::asText(&local_48,&this->builder);
    value.content.ptr = local_48.content.ptr;
    value._0_8_ = local_48._0_8_;
    value.content.size_ = local_48.content.size_;
    DynamicValue::Builder::Builder(__return_storage_ptr__,value);
    break;
  case DATA:
    local_58 = (ArrayPtr<unsigned_char>)capnp::_::OrphanBuilder::asData(&this->builder);
    DynamicValue::Builder::Builder(__return_storage_ptr__,(Builder)local_58);
    break;
  case LIST:
    WVar2 = ListSchema::whichElementType(&(this->field_1).listSchema);
    if (WVar2 == STRUCT) {
      local_a0 = (this->field_1).intValue;
      local_98 = (anon_union_8_2_eba6ea51_for_Type_5)
                 ((anon_union_8_2_eba6ea51_for_Type_5 *)((long)&this->field_1 + 8))->schema;
      local_d8.raw = (RawBrandedSchema *)
                     ListSchema::getStructElementType(&(this->field_1).listSchema);
      local_cc = anon_unknown_70::structSizeFromSchema((StructSchema)local_d8.raw);
      capnp::_::OrphanBuilder::asStructList(&local_c8,&this->builder,local_cc);
      schema_00.elementType.field_4.schema = local_98.schema;
      schema_00.elementType.baseType = (undefined2)local_a0;
      schema_00.elementType.listDepth = local_a0._2_1_;
      schema_00.elementType.isImplicitParam = (bool)local_a0._3_1_;
      schema_00.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_a0._4_2_;
      schema_00.elementType._6_2_ = local_a0._6_2_;
      builder.capTable = local_c8.capTable;
      builder.segment = local_c8.segment;
      builder.ptr = local_c8.ptr;
      builder.elementCount = local_c8.elementCount;
      builder.step = local_c8.step;
      builder.structDataSize = local_c8.structDataSize;
      builder.structPointerCount = local_c8.structPointerCount;
      builder.elementSize = local_c8.elementSize;
      builder._39_1_ = local_c8._39_1_;
      DynamicList::Builder::Builder(&local_90,schema_00,builder);
      value_01.schema.elementType.field_4.schema = local_90.schema.elementType.field_4.schema;
      value_01.schema.elementType.baseType = local_90.schema.elementType.baseType;
      value_01.schema.elementType.listDepth = local_90.schema.elementType.listDepth;
      value_01.schema.elementType.isImplicitParam = local_90.schema.elementType.isImplicitParam;
      value_01.schema.elementType.field_3 = local_90.schema.elementType.field_3;
      value_01.schema.elementType._6_2_ = local_90.schema.elementType._6_2_;
      value_01.builder.segment = local_90.builder.segment;
      value_01.builder.capTable = local_90.builder.capTable;
      value_01.builder.ptr = local_90.builder.ptr;
      value_01.builder.elementCount = local_90.builder.elementCount;
      value_01.builder.step = local_90.builder.step;
      value_01.builder.structDataSize = local_90.builder.structDataSize;
      value_01.builder.structPointerCount = local_90.builder.structPointerCount;
      value_01.builder.elementSize = local_90.builder.elementSize;
      value_01.builder._39_1_ = local_90.builder._39_1_;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_01);
    }
    else {
      local_120 = (this->field_1).intValue;
      local_118 = (anon_union_8_2_eba6ea51_for_Type_5)
                  ((anon_union_8_2_eba6ea51_for_Type_5 *)((long)&this->field_1 + 8))->schema;
      WVar2 = ListSchema::whichElementType(&(this->field_1).listSchema);
      elementSize = anon_unknown_70::elementSizeFor(WVar2);
      capnp::_::OrphanBuilder::asList(&local_148,&this->builder,elementSize);
      schema.elementType.field_4.schema = local_118.schema;
      schema.elementType.baseType = (undefined2)local_120;
      schema.elementType.listDepth = local_120._2_1_;
      schema.elementType.isImplicitParam = (bool)local_120._3_1_;
      schema.elementType.field_3 = (anon_union_2_2_d12d5221_for_Type_3)local_120._4_2_;
      schema.elementType._6_2_ = local_120._6_2_;
      builder_00.capTable = local_148.capTable;
      builder_00.segment = local_148.segment;
      builder_00.ptr = local_148.ptr;
      builder_00.elementCount = local_148.elementCount;
      builder_00.step = local_148.step;
      builder_00.structDataSize = local_148.structDataSize;
      builder_00.structPointerCount = local_148.structPointerCount;
      builder_00.elementSize = local_148.elementSize;
      builder_00._39_1_ = local_148._39_1_;
      DynamicList::Builder::Builder(&local_110,schema,builder_00);
      value_02.schema.elementType.field_4.schema = local_110.schema.elementType.field_4.schema;
      value_02.schema.elementType.baseType = local_110.schema.elementType.baseType;
      value_02.schema.elementType.listDepth = local_110.schema.elementType.listDepth;
      value_02.schema.elementType.isImplicitParam = local_110.schema.elementType.isImplicitParam;
      value_02.schema.elementType.field_3 = local_110.schema.elementType.field_3;
      value_02.schema.elementType._6_2_ = local_110.schema.elementType._6_2_;
      value_02.builder.segment = local_110.builder.segment;
      value_02.builder.capTable = local_110.builder.capTable;
      value_02.builder.ptr = local_110.builder.ptr;
      value_02.builder.elementCount = local_110.builder.elementCount;
      value_02.builder.step = local_110.builder.step;
      value_02.builder.structDataSize = local_110.builder.structDataSize;
      value_02.builder.structPointerCount = local_110.builder.structPointerCount;
      value_02.builder.elementSize = local_110.builder.elementSize;
      value_02.builder._39_1_ = local_110.builder._39_1_;
      DynamicValue::Builder::Builder(__return_storage_ptr__,value_02);
    }
    break;
  case ENUM:
    local_30 = (this->field_1).intValue;
    uVar1 = *(undefined8 *)((long)&this->field_1 + 8);
    local_28 = (undefined2)uVar1;
    uStack_26 = (undefined6)((ulong)uVar1 >> 0x10);
    value_03._10_6_ = 0;
    value_03._0_10_ = *(unkuint10 *)&this->field_1;
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_03);
    break;
  case STRUCT:
    local_180.raw = (this->field_1).structSchema.super_Schema.raw;
    local_1b8.raw = (this->field_1).structSchema.super_Schema.raw;
    local_1ac = anon_unknown_70::structSizeFromSchema((StructSchema)local_1b8.raw);
    capnp::_::OrphanBuilder::asStruct(&local_1a8,&this->builder,local_1ac);
    builder_01.capTable = local_1a8.capTable;
    builder_01.segment = local_1a8.segment;
    builder_01.data = local_1a8.data;
    builder_01.pointers = local_1a8.pointers;
    builder_01.dataSize = local_1a8.dataSize;
    builder_01.pointerCount = local_1a8.pointerCount;
    builder_01._38_2_ = local_1a8._38_2_;
    DynamicStruct::Builder::Builder(&local_178,(StructSchema)local_180.raw,builder_01);
    value_00.builder.segment = local_178.builder.segment;
    value_00.schema.super_Schema.raw = local_178.schema.super_Schema.raw;
    value_00.builder.capTable = local_178.builder.capTable;
    value_00.builder.data = local_178.builder.data;
    value_00.builder.pointers = local_178.builder.pointers;
    value_00.builder.dataSize = local_178.builder.dataSize;
    value_00.builder.pointerCount = local_178.builder.pointerCount;
    value_00.builder._38_2_ = local_178.builder._38_2_;
    DynamicValue::Builder::Builder(__return_storage_ptr__,value_00);
    break;
  case CAPABILITY:
    local_1e8._16_8_ = (this->field_1).interfaceSchema.super_Schema.raw;
    capnp::_::OrphanBuilder::asCapability((OrphanBuilder *)local_1e8);
    DynamicCapability::Client::Client
              ((Client *)(local_1e8 + 0x18),(InterfaceSchema)local_1e8._16_8_,
               (Own<capnp::ClientHook> *)local_1e8);
    DynamicValue::Builder::Builder(__return_storage_ptr__,(Client *)(local_1e8 + 0x18));
    DynamicCapability::Client::~Client((Client *)(local_1e8 + 0x18));
    kj::Own<capnp::ClientHook>::~Own((Own<capnp::ClientHook> *)local_1e8);
    break;
  case ANY_POINTER:
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[100]>
              (&local_200,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x82b,FAILED,(char *)0x0,
               "\"Can\'t get() an AnyPointer orphan; there is no underlying pointer to \" \"wrap in an AnyPointer::Builder.\""
               ,(char (*) [100])
                "Can\'t get() an AnyPointer orphan; there is no underlying pointer to wrap in an AnyPointer::Builder."
              );
    kj::_::Debug::Fault::fatal(&local_200);
  default:
    kj::_::unreachable();
  }
  return __return_storage_ptr__;
}

Assistant:

DynamicValue::Builder Orphan<DynamicValue>::get() {
  switch (type) {
    case DynamicValue::UNKNOWN: return nullptr;
    case DynamicValue::VOID: return voidValue;
    case DynamicValue::BOOL: return boolValue;
    case DynamicValue::INT: return intValue;
    case DynamicValue::UINT: return uintValue;
    case DynamicValue::FLOAT: return floatValue;
    case DynamicValue::ENUM: return enumValue;

    case DynamicValue::TEXT: return builder.asText();
    case DynamicValue::DATA: return builder.asData();
    case DynamicValue::LIST:
      if (listSchema.whichElementType() == schema::Type::STRUCT) {
        return DynamicList::Builder(listSchema,
            builder.asStructList(structSizeFromSchema(listSchema.getStructElementType())));
      } else {
        return DynamicList::Builder(listSchema,
            builder.asList(elementSizeFor(listSchema.whichElementType())));
      }
    case DynamicValue::STRUCT:
      return DynamicStruct::Builder(structSchema,
          builder.asStruct(structSizeFromSchema(structSchema)));
    case DynamicValue::CAPABILITY:
      return DynamicCapability::Client(interfaceSchema, builder.asCapability());
    case DynamicValue::ANY_POINTER:
      KJ_FAIL_REQUIRE("Can't get() an AnyPointer orphan; there is no underlying pointer to "
                      "wrap in an AnyPointer::Builder.");
  }
  KJ_UNREACHABLE;
}